

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

bool __thiscall sf::Window::setActive(Window *this,bool active)

{
  bool bVar1;
  ostream *poVar2;
  
  if (this->m_context != (GlContext *)0x0) {
    bVar1 = priv::GlContext::setActive(this->m_context,active);
    if (!bVar1) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to activate the window\'s context");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool Window::setActive(bool active) const
{
    if (m_context)
    {
        if (m_context->setActive(active))
        {
            return true;
        }
        else
        {
            err() << "Failed to activate the window's context" << std::endl;
            return false;
        }
    }
    else
    {
        return false;
    }
}